

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void pulse_prog_arangird_patrol(CHAR_DATA *mob)

{
  bool bVar1;
  int iVar2;
  OBJ_DATA *pOVar3;
  CHAR_DATA *pCVar4;
  long lVar5;
  
  if (mob->fighting != (CHAR_DATA *)0x0) {
    return;
  }
  if (mob->in_room == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  iVar2 = number_percent();
  if (iVar2 < 0x46) {
    return;
  }
  switch(mob->in_room->vnum) {
  case 0x5557:
    do_south(mob,"");
    break;
  case 0x5558:
  case 0x5559:
    do_west(mob,"");
    break;
  case 0x555a:
  case 0x555c:
    do_west(mob,"");
    goto LAB_002ec040;
  case 0x555b:
    do_north(mob,"");
    break;
  case 0x555d:
    do_north(mob,"");
LAB_002ec040:
    lVar5 = 0;
    goto LAB_002ec043;
  case 0x555e:
    do_north(mob,"");
    goto LAB_002ec029;
  case 0x555f:
  case 0x5563:
    do_east(mob,"");
    goto LAB_002ebffb;
  case 0x5560:
    do_south(mob,"");
    goto LAB_002ec029;
  case 0x5561:
  case 0x5562:
    do_east(mob,"");
LAB_002ec029:
    lVar5 = 1;
    goto LAB_002ec043;
  case 0x5564:
    do_south(mob,"");
LAB_002ebffb:
    lVar5 = 2;
    goto LAB_002ec043;
  default:
    goto switchD_002ebf81_default;
  }
  lVar5 = 3;
LAB_002ec043:
  for (pCVar4 = mob->in_room->people; pCVar4 != (CHAR_DATA *)0x0; pCVar4 = pCVar4->next_in_room) {
    bVar1 = is_npc(pCVar4);
    if (((!bVar1) && (bVar1 = is_immortal(pCVar4), !bVar1)) &&
       ((pOVar3 = get_eq_char(pCVar4,0xc), pOVar3 == (OBJ_DATA *)0x0 ||
        (pOVar3->pIndexData->vnum != 0x5528)))) {
      do_yell(mob,"Intruder!  Sound the alarm!");
      do_murder(mob,pCVar4->name);
      return;
    }
  }
  pCVar4 = ((mob->in_room->exit[lVar5]->u1).to_room)->people;
  if (pCVar4 != (CHAR_DATA *)0x0) {
    act("You hear the heavy footsteps of an approaching patrol echo through the caves.",pCVar4,
        (void *)0x0,(void *)0x0,4);
    return;
  }
switchD_002ebf81_default:
  return;
}

Assistant:

void pulse_prog_arangird_patrol(CHAR_DATA *mob)
{
	CHAR_DATA *vch;
	OBJ_DATA *robes;
	int dir_next = -1;

	if (mob->fighting)
		return;

	if (!mob->in_room)
		return;

	if (number_percent() < 70)
		return;

	switch (mob->in_room->vnum)
	{
		case 21847:
			do_south(mob, "");
			dir_next = Directions::West;
			break;
		case 21848:
			do_west(mob, "");
			dir_next = Directions::West;
			break;
		case 21849:
			do_west(mob, "");
			dir_next = Directions::West;
			break;
		case 21850:
			do_west(mob, "");
			dir_next = Directions::North;
			break;
		case 21851:
			do_north(mob, "");
			dir_next = Directions::West;
			break;
		case 21852:
			do_west(mob, "");
			dir_next = Directions::North;
			break;
		case 21853:
			do_north(mob, "");
			dir_next = Directions::North;
			break;
		case 21854:
			do_north(mob, "");
			dir_next = Directions::East;
			break;
		case 21855:
			do_east(mob, "");
			dir_next = Directions::South;
			break;
		case 21856:
			do_south(mob, "");
			dir_next = Directions::East;
			break;
		case 21857:
			do_east(mob, "");
			dir_next = Directions::East;
			break;
		case 21858:
			do_east(mob, "");
			dir_next = Directions::East;
			break;
		case 21859:
			do_east(mob, "");
			dir_next = Directions::South;
			break;
		case 21860:
			do_south(mob, "");
			dir_next = Directions::South;
			break;
		default:
			return;
	}

	for (vch = mob->in_room->people; vch; vch = vch->next_in_room)
	{
		if (is_npc(vch))
			continue;

		if (is_immortal(vch))
			continue;

		if ((robes = get_eq_char(vch, WEAR_ABOUT)) != nullptr && robes->pIndexData->vnum == 21800)
			continue;

		do_yell(mob, "Intruder!  Sound the alarm!");
		do_murder(mob, vch->name);
		return;
	}

	if (mob->in_room->exit[dir_next]->u1.to_room->people)
	{
		act("You hear the heavy footsteps of an approaching patrol echo through the caves.",
			mob->in_room->exit[dir_next]->u1.to_room->people, 0, 0, TO_ALL);
	}
}